

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O2

void __thiscall
test::iu_AssertionTest_x_iutest_x_MemCmpNE_Test::Body
          (iu_AssertionTest_x_iutest_x_MemCmpNE_Test *this)

{
  AssertionResult iutest_ar;
  iuCodeMessage local_1e0;
  TestObjectX y;
  TestObjectX x;
  Fixed local_190;
  
  x.a = 0;
  x.b = 1;
  x.c = 2;
  y.a = 0;
  y.b = 1;
  y.c = 3;
  iutest::internal::CmpHelperMemCmpNE<test::TestObjectX>(&iutest_ar,"x","y",&x,&y);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0x7a,iutest_ar.m_message._M_dataplus._M_p);
    local_1e0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e0,&local_190);
    std::__cxx11::string::~string((string *)&local_1e0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(AssertionTest, MemCmpNE)
{
    TestObjectX x={0, 1, 2};
    TestObjectX y={0, 1, 3};
    IUTEST_ASSERT_NE(x, y);
}